

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O1

QByteArray * escapedString(QByteArray *__return_storage_ptr__,QStringView s)

{
  byte *pbVar1;
  storage_type_conflict *psVar2;
  storage_type_conflict sVar3;
  storage_type_conflict sVar4;
  Data *pDVar5;
  char *pcVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  byte *pbVar10;
  char *pcVar11;
  storage_type_conflict *psVar12;
  char *pcVar13;
  byte bVar14;
  byte bVar15;
  ushort uVar16;
  long lVar17;
  qsizetype size;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  char *pcVar21;
  storage_type_conflict *psVar22;
  P _a;
  
  lVar17 = s.m_size;
  size = 0x10;
  if (0x10 < lVar17) {
    size = lVar17;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,size,Uninitialized);
  pcVar13 = (__return_storage_ptr__->d).ptr;
  if ((byte *)pcVar13 == (byte *)0x0) {
    pcVar13 = "";
  }
  if (lVar17 != 0) {
    psVar2 = s.m_data + lVar17;
    pbVar10 = (byte *)pcVar13 + (__return_storage_ptr__->d).size;
    psVar22 = s.m_data;
    do {
      if (pbVar10 + -6 <= pcVar13) {
        pcVar21 = (__return_storage_ptr__->d).ptr;
        if (pcVar21 == (char *)0x0) {
          pcVar21 = "";
        }
        QByteArray::resize(__return_storage_ptr__,(__return_storage_ptr__->d).size * 2);
        pDVar5 = (__return_storage_ptr__->d).d;
        if ((pDVar5 == (Data *)0x0) ||
           (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
        }
        pcVar6 = (__return_storage_ptr__->d).ptr;
        pcVar11 = pcVar6;
        if (pcVar6 == (char *)0x0) {
          pcVar11 = "";
        }
        pcVar13 = pcVar6 + ((long)pcVar13 - (long)pcVar21);
        pbVar10 = (byte *)(pcVar11 + (__return_storage_ptr__->d).size);
      }
      psVar12 = psVar22 + 1;
      sVar3 = *psVar22;
      uVar19 = (uint)(ushort)sVar3;
      if ((ushort)sVar3 < 0x80) {
        if ((((ushort)sVar3 < 0x20) || (sVar3 == L'\\')) || (uVar19 == 0x22)) {
          *pcVar13 = 0x5c;
          pbVar1 = (byte *)pcVar13 + 2;
          switch(sVar3) {
          case L'\b':
            ((byte *)pcVar13)[1] = 0x62;
            pcVar13 = (char *)pbVar1;
            break;
          case L'\t':
            ((byte *)pcVar13)[1] = 0x74;
            pcVar13 = (char *)pbVar1;
            break;
          case L'\n':
            ((byte *)pcVar13)[1] = 0x6e;
            pcVar13 = (char *)pbVar1;
            break;
          case L'\v':
switchD_002ff1bb_caseD_b:
            ((byte *)pcVar13)[1] = 0x75;
            ((byte *)pcVar13)[2] = 0x30;
            ((byte *)pcVar13)[3] = 0x30;
            bVar18 = (byte)((ushort)sVar3 >> 4) | 0x30;
            goto LAB_002ff36d;
          case L'\f':
            ((byte *)pcVar13)[1] = 0x66;
            pcVar13 = (char *)pbVar1;
            break;
          case L'\r':
            ((byte *)pcVar13)[1] = 0x72;
            pcVar13 = (char *)pbVar1;
            break;
          default:
            if (uVar19 == 0x5c) {
              ((byte *)pcVar13)[1] = 0x5c;
              pcVar13 = (char *)pbVar1;
            }
            else {
              if (uVar19 != 0x22) goto switchD_002ff1bb_caseD_b;
              ((byte *)pcVar13)[1] = 0x22;
              pcVar13 = (char *)pbVar1;
            }
          }
        }
        else {
          *pcVar13 = (byte)sVar3;
          pcVar13 = (char *)((byte *)pcVar13 + 1);
        }
      }
      else {
        bVar18 = (byte)((ushort)sVar3 >> 8);
        uVar20 = uVar19;
        if (uVar19 < 0x800) {
          bVar14 = (byte)((ushort)sVar3 >> 6) | 0xc0;
LAB_002ff2d7:
          *pcVar13 = bVar14;
          ((byte *)pcVar13)[1] = (byte)uVar20 & 0x3f | 0x80;
          pcVar13 = (char *)((byte *)pcVar13 + 2);
          bVar9 = false;
        }
        else {
          if ((uVar19 & 0xf800) != 0xd800) {
            *pcVar13 = bVar18 >> 4 | 0xe0;
            pcVar13 = (char *)((byte *)pcVar13 + 1);
LAB_002ff2ca:
            bVar14 = (byte)(uVar20 >> 6) & 0x3f | 0x80;
            goto LAB_002ff2d7;
          }
          bVar9 = true;
          if (psVar12 != psVar2) {
            if (((uVar19 & 0xdc00) == 0xd800) &&
               (sVar4 = *psVar12, ((ushort)sVar4 & 0xfc00) == 0xdc00)) {
              psVar12 = psVar22 + 2;
              uVar20 = uVar19 * 0x400 + (uint)(ushort)sVar4 + 0xfca02400;
              *pcVar13 = (byte)(uVar20 >> 0x12) | 0xf0;
              ((byte *)pcVar13)[1] = (byte)(uVar20 >> 0xc) & 0x3f | 0x80;
              pcVar13 = (char *)((byte *)pcVar13 + 2);
              bVar8 = true;
            }
            else {
              bVar8 = false;
            }
            if (bVar8) goto LAB_002ff2ca;
          }
        }
        if (bVar9) {
          ((byte *)pcVar13)[0] = 0x5c;
          ((byte *)pcVar13)[1] = 0x75;
          bVar14 = (bVar18 >> 4) + 0x57;
          if (uVar19 < 0xa000) {
            bVar14 = bVar18 >> 4 | 0x30;
          }
          uVar16 = (ushort)sVar3 >> 8 & 0xf;
          cVar7 = (char)uVar16;
          bVar18 = cVar7 + 0x57;
          if (uVar16 < 10) {
            bVar18 = cVar7 + 0x30;
          }
          ((byte *)pcVar13)[2] = bVar14;
          ((byte *)pcVar13)[3] = bVar18;
          uVar16 = (ushort)sVar3 >> 4 & 0xf;
          cVar7 = (char)uVar16;
          bVar18 = cVar7 + 0x57;
          if (uVar16 < 10) {
            bVar18 = cVar7 + 0x30;
          }
LAB_002ff36d:
          bVar14 = (byte)sVar3 & 0xf;
          bVar15 = bVar14 + 0x57;
          if ((uVar19 & 0xf) < 10) {
            bVar15 = bVar14 + 0x30;
          }
          ((byte *)pcVar13)[4] = bVar18;
          ((byte *)pcVar13)[5] = bVar15;
          pcVar13 = (char *)((byte *)pcVar13 + 6);
        }
      }
      psVar22 = psVar12;
    } while (psVar12 != psVar2);
  }
  pcVar21 = (__return_storage_ptr__->d).ptr;
  if (pcVar21 == (char *)0x0) {
    pcVar21 = "";
  }
  QByteArray::resize(__return_storage_ptr__,(long)pcVar13 - (long)pcVar21);
  return __return_storage_ptr__;
}

Assistant:

static QByteArray escapedString(QStringView s)
{
    // give it a minimum size to ensure the resize() below always adds enough space
    QByteArray ba(qMax(s.size(), 16), Qt::Uninitialized);

    auto ba_const_start = [&]() { return reinterpret_cast<const uchar *>(ba.constData()); };
    uchar *cursor = reinterpret_cast<uchar *>(const_cast<char *>(ba.constData()));
    const uchar *ba_end = cursor + ba.size();
    const char16_t *src = s.utf16();
    const char16_t *const end = s.utf16() + s.size();

    while (src != end) {
        if (cursor >= ba_end - 6) {
            // ensure we have enough space
            qptrdiff pos = cursor - ba_const_start();
            ba.resize(ba.size()*2);
            cursor = reinterpret_cast<uchar *>(ba.data()) + pos;
            ba_end = ba_const_start() + ba.size();
        }

        char16_t u = *src++;
        if (u < 0x80) {
            if (u < 0x20 || u == 0x22 || u == 0x5c) {
                *cursor++ = '\\';
                switch (u) {
                case 0x22:
                    *cursor++ = '"';
                    break;
                case 0x5c:
                    *cursor++ = '\\';
                    break;
                case 0x8:
                    *cursor++ = 'b';
                    break;
                case 0xc:
                    *cursor++ = 'f';
                    break;
                case 0xa:
                    *cursor++ = 'n';
                    break;
                case 0xd:
                    *cursor++ = 'r';
                    break;
                case 0x9:
                    *cursor++ = 't';
                    break;
                default:
                    *cursor++ = 'u';
                    *cursor++ = '0';
                    *cursor++ = '0';
                    *cursor++ = hexdig(u>>4);
                    *cursor++ = hexdig(u & 0xf);
               }
            } else {
                *cursor++ = (uchar)u;
            }
        } else if (QUtf8Functions::toUtf8<QUtf8BaseTraits>(u, cursor, src, end) < 0) {
            // failed to get valid utf8 use JSON escape sequence
            *cursor++ = '\\';
            *cursor++ = 'u';
            *cursor++ = hexdig(u>>12 & 0x0f);
            *cursor++ = hexdig(u>>8 & 0x0f);
            *cursor++ = hexdig(u>>4 & 0x0f);
            *cursor++ = hexdig(u & 0x0f);
        }
    }

    ba.resize(cursor - ba_const_start());
    return ba;
}